

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
OneNode::Evaluate(string *__return_storage_ptr__,OneNode *this,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *parameters,cmGeneratorExpressionContext *param_2,
                 GeneratorExpressionContent *param_3,cmGeneratorExpressionDAGChecker *param_4)

{
  pointer pbVar1;
  pointer pcVar2;
  
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar1->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* /*context*/,
    const GeneratorExpressionContent* /*content*/,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    return parameters.front();
  }